

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O1

bool __thiscall AV1Kmeans::AV1KmeansTest1::CheckResult(AV1KmeansTest1 *this,int n)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = n < 1;
  if (0 < n) {
    if (this->indices1_[0] == this->indices2_[0]) {
      uVar1 = (ulong)(uint)n;
      uVar4 = 0;
      do {
        if (uVar1 - 1 == uVar4) {
          return uVar1 <= uVar4 + 1;
        }
        lVar2 = uVar4 + 1;
        uVar5 = uVar4 + 1;
        lVar3 = uVar4 + 1;
        uVar4 = uVar5;
      } while (this->indices1_[lVar2] == this->indices2_[lVar3]);
      bVar6 = uVar1 <= uVar5;
    }
    else {
      uVar5 = 0;
    }
    printf("%d ",uVar5 & 0xffffffff);
    printf("%d != %d ",(ulong)this->indices1_[uVar5],(ulong)this->indices2_[uVar5]);
  }
  return bVar6;
}

Assistant:

bool CheckResult(int n) {
    for (int idx = 0; idx < n; ++idx) {
      if (indices1_[idx] != indices2_[idx]) {
        printf("%d ", idx);
        printf("%d != %d ", indices1_[idx], indices2_[idx]);
        return false;
      }
    }
    return true;
  }